

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformLocTypesStructs::UniformLocTypesStructs(UniformLocTypesStructs *this)

{
  UniformLocTypesStructs *this_local;
  
  ExplicitUniformLocationCaseBase::ExplicitUniformLocationCaseBase
            (&this->super_ExplicitUniformLocationCaseBase);
  (this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__UniformLocTypesStructs_0325a180;
  return;
}

Assistant:

virtual long Run()
	{

		/**
		 * This test case uses following uniform declarations:
		 *
		 * struct S {
		 *   vec4  u0;
		 *   float u1[2];
		 *   mat2  u2;
		 * };
		 * layout (location = 1) uniform S s0[3];
		 * layout (location = 13) uniform S s1;
		 */

		std::vector<UniformType> members;
		members.push_back(GL_FLOAT_VEC4);
		members.push_back(UniformType(GL_FLOAT, 2));
		members.push_back(GL_FLOAT_MAT2);
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(uniformStructCounter, members, 3), Loc::C(1)));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(uniformStructCounter, members), Loc::C(13)));
		return doRun(uniforms);
	}